

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O0

uint __thiscall Memory::LargeHeapBlock::GetMarkCount(LargeHeapBlock *this)

{
  Recycler *pRVar1;
  LargeObjectHeader *this_00;
  bool bVar2;
  LargeObjectHeader **ppLVar3;
  void *address;
  LargeObjectHeader *header;
  uint i;
  HeapBlockMap *heapBlockMap;
  uint markCount;
  LargeHeapBlock *this_local;
  
  heapBlockMap._4_4_ = 0;
  pRVar1 = this->heapInfo->recycler;
  for (header._4_4_ = 0; header._4_4_ < this->allocCount; header._4_4_ = header._4_4_ + 1) {
    ppLVar3 = HeaderList(this);
    this_00 = ppLVar3[header._4_4_];
    if ((this_00 != (LargeObjectHeader *)0x0) && (this_00->objectIndex == header._4_4_)) {
      address = LargeObjectHeader::GetAddress(this_00);
      bVar2 = HeapBlockMap64::IsMarked(&pRVar1->heapBlockMap,address);
      if (bVar2) {
        heapBlockMap._4_4_ = heapBlockMap._4_4_ + 1;
      }
    }
  }
  return heapBlockMap._4_4_;
}

Assistant:

uint
LargeHeapBlock::GetMarkCount()
{
    uint markCount = 0;
    const HeapBlockMap& heapBlockMap = this->heapInfo->recycler->heapBlockMap;

    for (uint i = 0; i < allocCount; i++)
    {
        LargeObjectHeader* header = this->HeaderList()[i];
        if (header && header->objectIndex == i && heapBlockMap.IsMarked(header->GetAddress()))
        {
            markCount++;
        }
    }

    return markCount;
}